

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O2

void __thiscall
discordpp::ChannelMention::ChannelMention(ChannelMention *this,ChannelMention *param_1)

{
  field<discordpp::Snowflake>::field(&this->id,&param_1->id);
  field<discordpp::Snowflake>::field(&this->guild_id,&param_1->guild_id);
  field<int>::field(&this->type,&param_1->type);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->name,&param_1->name);
  return;
}

Assistant:

ChannelMention(
        field<Snowflake> id = uninitialized,
        field<Snowflake> guild_id = uninitialized,
        field<int> type = uninitialized,
        field<std::string> name = uninitialized
    ):
        id(id),
        guild_id(guild_id),
        type(type),
        name(name)
    {}